

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectedEnergyAreaAimpoint.cpp
# Opt level: O2

bool __thiscall
DIS::DirectedEnergyAreaAimpoint::operator==
          (DirectedEnergyAreaAimpoint *this,DirectedEnergyAreaAimpoint *rhs)

{
  pointer pBVar1;
  pointer pDVar2;
  bool bVar3;
  bool bVar4;
  size_t idx;
  ulong uVar5;
  size_t idx_1;
  long lVar6;
  
  bVar4 = (this->_padding == rhs->_padding && rhs->_recordLength == this->_recordLength) &&
          this->_recordType == rhs->_recordType;
  lVar6 = 0;
  for (uVar5 = 0;
      pBVar1 = (this->_beamAntennaParameterList).
               super__Vector_base<DIS::BeamAntennaPattern,_std::allocator<DIS::BeamAntennaPattern>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->_beamAntennaParameterList).
                            super__Vector_base<DIS::BeamAntennaPattern,_std::allocator<DIS::BeamAntennaPattern>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 6);
      uVar5 = uVar5 + 1) {
    bVar3 = BeamAntennaPattern::operator==
                      ((BeamAntennaPattern *)((long)&pBVar1->_vptr_BeamAntennaPattern + lVar6),
                       (BeamAntennaPattern *)
                       ((long)&((rhs->_beamAntennaParameterList).
                                super__Vector_base<DIS::BeamAntennaPattern,_std::allocator<DIS::BeamAntennaPattern>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_vptr_BeamAntennaPattern
                       + lVar6));
    bVar4 = (bool)(bVar4 & bVar3);
    lVar6 = lVar6 + 0x40;
  }
  lVar6 = 0;
  for (uVar5 = 0;
      pDVar2 = (this->_directedEnergyTargetEnergyDepositionRecordList).
               super__Vector_base<DIS::DirectedEnergyTargetEnergyDeposition,_std::allocator<DIS::DirectedEnergyTargetEnergyDeposition>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)(((long)(this->_directedEnergyTargetEnergyDepositionRecordList).
                             super__Vector_base<DIS::DirectedEnergyTargetEnergyDeposition,_std::allocator<DIS::DirectedEnergyTargetEnergyDeposition>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar2) / 0x30);
      uVar5 = uVar5 + 1) {
    bVar3 = DirectedEnergyTargetEnergyDeposition::operator==
                      ((DirectedEnergyTargetEnergyDeposition *)
                       ((long)&pDVar2->_vptr_DirectedEnergyTargetEnergyDeposition + lVar6),
                       (DirectedEnergyTargetEnergyDeposition *)
                       ((long)&((rhs->_directedEnergyTargetEnergyDepositionRecordList).
                                super__Vector_base<DIS::DirectedEnergyTargetEnergyDeposition,_std::allocator<DIS::DirectedEnergyTargetEnergyDeposition>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                               _vptr_DirectedEnergyTargetEnergyDeposition + lVar6));
    bVar4 = (bool)(bVar4 & bVar3);
    lVar6 = lVar6 + 0x30;
  }
  return bVar4;
}

Assistant:

bool DirectedEnergyAreaAimpoint::operator ==(const DirectedEnergyAreaAimpoint& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_recordType == rhs._recordType) ) ivarsEqual = false;
     if( ! (_recordLength == rhs._recordLength) ) ivarsEqual = false;
     if( ! (_padding == rhs._padding) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _beamAntennaParameterList.size(); idx++)
     {
        if( ! ( _beamAntennaParameterList[idx] == rhs._beamAntennaParameterList[idx]) ) ivarsEqual = false;
     }


     for(size_t idx = 0; idx < _directedEnergyTargetEnergyDepositionRecordList.size(); idx++)
     {
        if( ! ( _directedEnergyTargetEnergyDepositionRecordList[idx] == rhs._directedEnergyTargetEnergyDepositionRecordList[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }